

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

bool __thiscall
google::anon_unknown_8::LogFileObject::CreateLogfile(LogFileObject *this,string *time_pid_string)

{
  pointer pcVar1;
  FILE *__stream;
  size_type sVar2;
  long *__name;
  int __fd;
  int iVar3;
  FILE *pFVar4;
  char *pcVar5;
  long *plVar6;
  long *plVar7;
  bool bVar8;
  string linkpath;
  string linkname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string string_filename;
  char *local_d0;
  ulong local_c8;
  char local_c0;
  undefined7 uStack_bf;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90 [2];
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  pcVar1 = (this->base_filename_)._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + (this->base_filename_)._M_string_length);
  if (fLB::FLAGS_timestamp_in_logfile_name == 1) {
    std::__cxx11::string::_M_append((char *)local_50,(ulong)(time_pid_string->_M_dataplus)._M_p);
  }
  std::__cxx11::string::_M_append
            ((char *)local_50,(ulong)(this->filename_extension_)._M_dataplus._M_p);
  __name = local_50[0];
  __fd = open((char *)local_50[0],(uint)fLB::FLAGS_timestamp_in_logfile_name << 7 | 0x41,
              (ulong)fLI::FLAGS_logfile_mode);
  if (__fd != -1) {
    fcntl(__fd,2,1);
    CreateLogfile::w_lock.l_type = 1;
    CreateLogfile::w_lock.l_whence = 0;
    CreateLogfile::w_lock.l_start = 0;
    CreateLogfile::w_lock.l_len = 0;
    iVar3 = fcntl(__fd,6,&CreateLogfile::w_lock);
    if (iVar3 == -1) {
      close(__fd);
    }
    else {
      pFVar4 = fdopen(__fd,"a");
      __stream = (FILE *)(this->file_)._M_t.
                         super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>._M_t.
                         super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>.
                         super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl;
      (this->file_)._M_t.super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>._M_t.
      super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>.
      super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl = (_IO_FILE *)pFVar4;
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
        pFVar4 = (FILE *)(this->file_)._M_t.
                         super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>._M_t.
                         super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>.
                         super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl;
      }
      if (pFVar4 != (FILE *)0x0) {
        sVar2 = (this->symlink_basename_)._M_string_length;
        bVar8 = true;
        if (sVar2 != 0) {
          pcVar5 = strrchr((char *)__name,0x2f);
          local_d0 = &local_c0;
          pcVar1 = (this->symlink_basename_)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>((string *)&local_d0,pcVar1,pcVar1 + sVar2);
          std::__cxx11::string::_M_replace_aux((ulong)&local_d0,local_c8,0,'\x01');
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
          local_b0 = &local_a0;
          plVar7 = plVar6 + 2;
          if ((long *)*plVar6 == plVar7) {
            local_a0 = *plVar7;
            lStack_98 = plVar6[3];
          }
          else {
            local_a0 = *plVar7;
            local_b0 = (long *)*plVar6;
          }
          local_a8 = plVar6[1];
          *plVar6 = (long)plVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if (local_d0 != &local_c0) {
            operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
          }
          local_d0 = &local_c0;
          local_c8 = 0;
          local_c0 = '\0';
          if (pcVar5 != (char *)0x0) {
            local_70 = &local_60;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,__name,pcVar5 + 1);
            std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_70);
            if (local_70 != &local_60) {
              operator_delete(local_70,local_60 + 1);
            }
          }
          std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0);
          unlink(local_d0);
          plVar6 = (long *)(pcVar5 + 1);
          if (pcVar5 == (char *)0x0) {
            plVar6 = __name;
          }
          symlink((char *)plVar6,local_d0);
          if (_DAT_00133b18 != 0) {
            local_90[0] = local_80;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_90,fLS::FLAGS_log_link_buf_abi_cxx11_,
                       _DAT_00133b18 + fLS::FLAGS_log_link_buf_abi_cxx11_);
            std::__cxx11::string::append((char *)local_90);
            plVar6 = (long *)std::__cxx11::string::_M_append((char *)local_90,(ulong)local_b0);
            plVar7 = plVar6 + 2;
            if ((long *)*plVar6 == plVar7) {
              local_60 = *plVar7;
              lStack_58 = plVar6[3];
              local_70 = &local_60;
            }
            else {
              local_60 = *plVar7;
              local_70 = (long *)*plVar6;
            }
            local_68 = plVar6[1];
            *plVar6 = (long)plVar7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_70);
            if (local_70 != &local_60) {
              operator_delete(local_70,local_60 + 1);
            }
            if (local_90[0] != local_80) {
              operator_delete(local_90[0],local_80[0] + 1);
            }
            unlink(local_d0);
            symlink((char *)__name,local_d0);
          }
          if (local_d0 != &local_c0) {
            operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
          }
          if (local_b0 != &local_a0) {
            operator_delete(local_b0,local_a0 + 1);
          }
        }
        goto LAB_001102af;
      }
      if (fLB::FLAGS_timestamp_in_logfile_name == 1) {
        unlink((char *)__name);
      }
    }
  }
  bVar8 = false;
LAB_001102af:
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return bVar8;
}

Assistant:

bool LogFileObject::CreateLogfile(const string& time_pid_string) {
  string string_filename = base_filename_;
  if (FLAGS_timestamp_in_logfile_name) {
    string_filename += time_pid_string;
  }
  string_filename += filename_extension_;
  const char* filename = string_filename.c_str();
  // only write to files, create if non-existant.
  int flags = O_WRONLY | O_CREAT;
  if (FLAGS_timestamp_in_logfile_name) {
    // demand that the file is unique for our timestamp (fail if it exists).
    flags = flags | O_EXCL;
  }
  FileDescriptor fd{
      open(filename, flags, static_cast<mode_t>(FLAGS_logfile_mode))};
  if (!fd) return false;
#ifdef HAVE_FCNTL
  // Mark the file close-on-exec. We don't really care if this fails
  fcntl(fd.get(), F_SETFD, FD_CLOEXEC);

  // Mark the file as exclusive write access to avoid two clients logging to the
  // same file. This applies particularly when !FLAGS_timestamp_in_logfile_name
  // (otherwise open would fail because the O_EXCL flag on similar filename).
  // locks are released on unlock or close() automatically, only after log is
  // released.
  // This will work after a fork as it is not inherited (not stored in the fd).
  // Lock will not be lost because the file is opened with exclusive lock
  // (write) and we will never read from it inside the process.
  // TODO: windows implementation of this (as flock is not available on
  // mingw).
  static struct flock w_lock;

  w_lock.l_type = F_WRLCK;
  w_lock.l_start = 0;
  w_lock.l_whence = SEEK_SET;
  w_lock.l_len = 0;

  int wlock_ret = fcntl(fd.get(), F_SETLK, &w_lock);
  if (wlock_ret == -1) {
    return false;
  }
#endif

  // fdopen in append mode so if the file exists it will fseek to the end
  file_.reset(fdopen(fd.release(), "a"));  // Make a FILE*.
  if (file_ == nullptr) {                  // Man, we're screwed!
    if (FLAGS_timestamp_in_logfile_name) {
      unlink(filename);  // Erase the half-baked evidence: an unusable log file,
                         // only if we just created it.
    }
    return false;
  }
#ifdef GLOG_OS_WINDOWS
  // https://github.com/golang/go/issues/27638 - make sure we seek to the end to
  // append empirically replicated with wine over mingw build
  if (!FLAGS_timestamp_in_logfile_name) {
    if (fseek(file_.get(), 0, SEEK_END) != 0) {
      return false;
    }
  }
#endif
  // We try to create a symlink called <program_name>.<severity>,
  // which is easier to use.  (Every time we create a new logfile,
  // we destroy the old symlink and create a new one, so it always
  // points to the latest logfile.)  If it fails, we're sad but it's
  // no error.
  if (!symlink_basename_.empty()) {
    // take directory from filename
    const char* slash = strrchr(filename, PATH_SEPARATOR);
    const string linkname =
        symlink_basename_ + '.' + LogSeverityNames[severity_];
    string linkpath;
    if (slash)
      linkpath = string(
          filename, static_cast<size_t>(slash - filename + 1));  // get dirname
    linkpath += linkname;
    unlink(linkpath.c_str());  // delete old one if it exists

#if defined(GLOG_OS_WINDOWS)
    // TODO(hamaji): Create lnk file on Windows?
#elif defined(HAVE_UNISTD_H)
    // We must have unistd.h.
    // Make the symlink be relative (in the same dir) so that if the
    // entire log directory gets relocated the link is still valid.
    const char* linkdest = slash ? (slash + 1) : filename;
    if (symlink(linkdest, linkpath.c_str()) != 0) {
      // silently ignore failures
    }

    // Make an additional link to the log file in a place specified by
    // FLAGS_log_link, if indicated
    if (!FLAGS_log_link.empty()) {
      linkpath = FLAGS_log_link + "/" + linkname;
      unlink(linkpath.c_str());  // delete old one if it exists
      if (symlink(filename, linkpath.c_str()) != 0) {
        // silently ignore failures
      }
    }
#endif
  }

  return true;  // Everything worked
}